

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.h
# Opt level: O0

bool __thiscall flow::Signature::operator!=(Signature *this,Signature *v)

{
  bool bVar1;
  string local_58;
  string local_38;
  Signature *local_18;
  Signature *v_local;
  Signature *this_local;
  
  local_18 = v;
  v_local = this;
  to_s_abi_cxx11_(&local_38,this);
  to_s_abi_cxx11_(&local_58,local_18);
  bVar1 = std::operator!=(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool operator!=(const Signature& v) const { return to_s() != v.to_s(); }